

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O1

void * Abc_ObjMvVar(Abc_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int *piVar4;
  void *pvVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  
  pVVar3 = pObj->pNtk->vAttrs;
  if (pVVar3->nSize < 0xd) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  piVar4 = (int *)pVVar3->pArray[0xc];
  if (piVar4 == (int *)0x0) {
    pvVar5 = (void *)0x0;
  }
  else {
    if (*(void **)(piVar4 + 2) == (void *)0x0) {
      __assert_fail("p->pArrayPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                    ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
    }
    iVar1 = pObj->Id;
    lVar8 = (long)iVar1;
    iVar2 = *piVar4;
    if (iVar2 <= iVar1) {
      iVar7 = iVar1 + 10;
      if (iVar1 < iVar2 * 2) {
        iVar7 = iVar2 * 2;
      }
      if (iVar2 < iVar7) {
        pvVar5 = realloc(*(void **)(piVar4 + 2),(long)iVar7 * 8);
        *(void **)(piVar4 + 2) = pvVar5;
        memset((void *)((long)pvVar5 + (long)*piVar4 * 8),0,((long)iVar7 - (long)*piVar4) * 8);
        *piVar4 = iVar7;
      }
    }
    if ((*(long *)(*(long *)(piVar4 + 2) + lVar8 * 8) == 0) &&
       (*(code **)(piVar4 + 8) != (code *)0x0)) {
      uVar6 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
      *(undefined8 *)(*(long *)(piVar4 + 2) + lVar8 * 8) = uVar6;
    }
    pvVar5 = *(void **)(*(long *)(piVar4 + 2) + lVar8 * 8);
  }
  return pvVar5;
}

Assistant:

static inline void *      Abc_ObjMvVar( Abc_Obj_t * pObj )              { return Abc_NtkMvVar(pObj->pNtk)? Vec_AttEntry( (Vec_Att_t *)Abc_NtkMvVar(pObj->pNtk), pObj->Id ) : NULL; }